

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  byte bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined4 uVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined4 uVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar86 [64];
  undefined1 auVar53 [32];
  
  fVar11 = scale * r_scale0;
  pBVar6 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.vertices.
           items;
  uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = pBVar6[itime].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[itime].super_RawBufferView.stride;
  lVar31 = (uVar5 + 1) * sVar8;
  lVar30 = (uVar5 + 2) * sVar8;
  lVar29 = (uVar5 + 3) * sVar8;
  aVar2 = ofs->field_0;
  auVar39 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + uVar5 * sVar8),(undefined1  [16])aVar2);
  auVar41._0_4_ = scale * auVar39._0_4_;
  auVar41._4_4_ = scale * auVar39._4_4_;
  auVar41._8_4_ = scale * auVar39._8_4_;
  auVar41._12_4_ = scale * auVar39._12_4_;
  auVar40._4_4_ = auVar41._0_4_;
  auVar40._0_4_ = auVar41._0_4_;
  auVar40._8_4_ = auVar41._0_4_;
  auVar40._12_4_ = auVar41._0_4_;
  auVar39 = vshufps_avx(auVar41,auVar41,0x55);
  aVar3 = (space->vx).field_0;
  auVar32 = vshufps_avx(auVar41,auVar41,0xaa);
  aVar4 = (space->vy).field_0;
  fVar23 = (space->vz).field_0.m128[0];
  fVar24 = (space->vz).field_0.m128[1];
  fVar25 = (space->vz).field_0.m128[2];
  fVar26 = (space->vz).field_0.m128[3];
  auVar42._0_4_ = fVar23 * auVar32._0_4_;
  auVar42._4_4_ = fVar24 * auVar32._4_4_;
  auVar42._8_4_ = fVar25 * auVar32._8_4_;
  auVar42._12_4_ = fVar26 * auVar32._12_4_;
  auVar39 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar4,auVar39);
  auVar41 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar40);
  fVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar12 = fVar11 * fVar1 * *(float *)(pcVar7 + uVar5 * sVar8 + 0xc);
  auVar39 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar31),(undefined1  [16])aVar2);
  auVar70._0_4_ = scale * auVar39._0_4_;
  auVar70._4_4_ = scale * auVar39._4_4_;
  auVar70._8_4_ = scale * auVar39._8_4_;
  auVar70._12_4_ = scale * auVar39._12_4_;
  auVar35._4_4_ = auVar70._0_4_;
  auVar35._0_4_ = auVar70._0_4_;
  auVar35._8_4_ = auVar70._0_4_;
  auVar35._12_4_ = auVar70._0_4_;
  auVar39 = vshufps_avx(auVar70,auVar70,0x55);
  auVar32 = vshufps_avx(auVar70,auVar70,0xaa);
  auVar34._0_4_ = fVar23 * auVar32._0_4_;
  auVar34._4_4_ = fVar24 * auVar32._4_4_;
  auVar34._8_4_ = fVar25 * auVar32._8_4_;
  auVar34._12_4_ = fVar26 * auVar32._12_4_;
  auVar39 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar4,auVar39);
  auVar42 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar35);
  fVar13 = fVar11 * fVar1 * *(float *)(pcVar7 + lVar31 + 0xc);
  auVar39 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar30),(undefined1  [16])aVar2);
  auVar71._0_4_ = scale * auVar39._0_4_;
  auVar71._4_4_ = scale * auVar39._4_4_;
  auVar71._8_4_ = scale * auVar39._8_4_;
  auVar71._12_4_ = scale * auVar39._12_4_;
  auVar33._4_4_ = auVar71._0_4_;
  auVar33._0_4_ = auVar71._0_4_;
  auVar33._8_4_ = auVar71._0_4_;
  auVar33._12_4_ = auVar71._0_4_;
  auVar39 = vshufps_avx(auVar71,auVar71,0x55);
  auVar32 = vshufps_avx(auVar71,auVar71,0xaa);
  auVar36._0_4_ = fVar23 * auVar32._0_4_;
  auVar36._4_4_ = fVar24 * auVar32._4_4_;
  auVar36._8_4_ = fVar25 * auVar32._8_4_;
  auVar36._12_4_ = fVar26 * auVar32._12_4_;
  auVar39 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar4,auVar39);
  auVar40 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar33);
  fVar14 = fVar11 * fVar1 * *(float *)(pcVar7 + lVar30 + 0xc);
  auVar39 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar29),(undefined1  [16])aVar2);
  auVar32._0_4_ = scale * auVar39._0_4_;
  auVar32._4_4_ = scale * auVar39._4_4_;
  auVar32._8_4_ = scale * auVar39._8_4_;
  auVar32._12_4_ = scale * auVar39._12_4_;
  auVar72._4_4_ = auVar32._0_4_;
  auVar72._0_4_ = auVar32._0_4_;
  auVar72._8_4_ = auVar32._0_4_;
  auVar72._12_4_ = auVar32._0_4_;
  auVar39 = vshufps_avx(auVar32,auVar32,0x55);
  auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
  auVar37._0_4_ = fVar23 * auVar32._0_4_;
  auVar37._4_4_ = fVar24 * auVar32._4_4_;
  auVar37._8_4_ = fVar25 * auVar32._8_4_;
  auVar37._12_4_ = fVar26 * auVar32._12_4_;
  auVar39 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar4,auVar39);
  auVar39 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar72);
  auVar32 = vmulss_avx512f(ZEXT416((uint)fVar11),
                           ZEXT416((uint)(fVar1 * *(float *)(pcVar7 + lVar29 + 0xc))));
  uVar5 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
          tessellationRate;
  uVar27 = (ulong)uVar5;
  uVar81 = auVar42._0_4_;
  uVar69 = auVar41._0_4_;
  if (uVar27 == 4) {
    auVar33 = vbroadcastss_avx512vl(auVar32);
    auVar32 = vblendps_avx(auVar39,auVar33,8);
    auVar75._4_4_ = fVar14;
    auVar75._0_4_ = fVar14;
    auVar75._8_4_ = fVar14;
    auVar75._12_4_ = fVar14;
    auVar70 = vblendps_avx(auVar40,auVar75,8);
    auVar73._4_4_ = fVar13;
    auVar73._0_4_ = fVar13;
    auVar73._8_4_ = fVar13;
    auVar73._12_4_ = fVar13;
    auVar71 = vblendps_avx(auVar42,auVar73,8);
    auVar80._4_4_ = uVar69;
    auVar80._0_4_ = uVar69;
    auVar80._8_4_ = uVar69;
    auVar80._12_4_ = uVar69;
    auVar72 = vshufps_avx(auVar41,auVar41,0x55);
    auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
    auVar67._4_4_ = fVar12;
    auVar67._0_4_ = fVar12;
    auVar67._8_4_ = fVar12;
    auVar67._12_4_ = fVar12;
    auVar84._4_4_ = uVar81;
    auVar84._0_4_ = uVar81;
    auVar84._8_4_ = uVar81;
    auVar84._12_4_ = uVar81;
    auVar34 = vshufps_avx512vl(auVar42,auVar42,0x55);
    auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
    auVar35 = vbroadcastss_avx512vl(auVar40);
    auVar36 = vshufps_avx512vl(auVar40,auVar40,0x55);
    auVar40 = vshufps_avx(auVar40,auVar40,0xaa);
    auVar37 = vbroadcastss_avx512vl(auVar39);
    auVar38 = vshufps_avx512vl(auVar39,auVar39,0x55);
    auVar39 = vshufps_avx(auVar39,auVar39,0xaa);
    auVar37 = vmulps_avx512vl(auVar37,bspline_basis0._3740_16_);
    auVar38 = vmulps_avx512vl(auVar38,bspline_basis0._3740_16_);
    auVar39 = vmulps_avx512vl(auVar39,bspline_basis0._3740_16_);
    auVar33 = vmulps_avx512vl(auVar33,bspline_basis0._3740_16_);
    auVar35 = vfmadd231ps_avx512vl(auVar37,bspline_basis0._2584_16_,auVar35);
    auVar36 = vfmadd231ps_avx512vl(auVar38,bspline_basis0._2584_16_,auVar36);
    auVar39 = vfmadd231ps_avx512vl(auVar39,bspline_basis0._2584_16_,auVar40);
    auVar40 = vfmadd231ps_avx512vl(auVar33,bspline_basis0._2584_16_,auVar75);
    auVar33 = vfmadd231ps_avx512vl(auVar35,bspline_basis0._1428_16_,auVar84);
    auVar34 = vfmadd231ps_avx512vl(auVar36,bspline_basis0._1428_16_,auVar34);
    auVar39 = vfmadd231ps_fma(auVar39,bspline_basis0._1428_16_,auVar42);
    auVar42 = vfmadd231ps_fma(auVar40,bspline_basis0._1428_16_,auVar73);
    auVar35 = vfmadd231ps_avx512vl(auVar33,bspline_basis0._272_16_,auVar80);
    auVar34 = vfmadd231ps_avx512vl(auVar34,bspline_basis0._272_16_,auVar72);
    auVar72 = vfmadd231ps_fma(auVar39,bspline_basis0._272_16_,auVar41);
    auVar33 = vfmadd231ps_fma(auVar42,bspline_basis0._272_16_,auVar67);
    auVar36 = vshufps_avx512vl(auVar35,auVar35,0xb1);
    auVar41 = vminps_avx512vl(auVar36,auVar35);
    auVar39 = vshufpd_avx(auVar41,auVar41,1);
    auVar39 = vminps_avx(auVar39,auVar41);
    auVar37 = vshufps_avx512vl(auVar34,auVar34,0xb1);
    auVar42 = vminps_avx512vl(auVar37,auVar34);
    auVar41 = vshufpd_avx(auVar42,auVar42,1);
    auVar41 = vminps_avx(auVar41,auVar42);
    auVar39 = vinsertps_avx(auVar39,auVar41,0x1c);
    auVar40 = vshufps_avx(auVar72,auVar72,0xb1);
    auVar41 = vminps_avx(auVar40,auVar72);
    auVar42 = vshufpd_avx(auVar41,auVar41,1);
    auVar41 = vminps_avx(auVar42,auVar41);
    auVar39 = vinsertps_avx(auVar39,auVar41,0x20);
    auVar42 = vmaxps_avx512vl(auVar36,auVar35);
    auVar41 = vshufpd_avx(auVar42,auVar42,1);
    auVar41 = vmaxps_avx(auVar41,auVar42);
    auVar34 = vmaxps_avx512vl(auVar37,auVar34);
    auVar42 = vshufpd_avx(auVar34,auVar34,1);
    auVar42 = vmaxps_avx(auVar42,auVar34);
    auVar41 = vinsertps_avx(auVar41,auVar42,0x1c);
    auVar42 = vmaxps_avx(auVar40,auVar72);
    auVar40 = vshufpd_avx(auVar42,auVar42,1);
    auVar42 = vmaxps_avx(auVar40,auVar42);
    auVar41 = vinsertps_avx(auVar41,auVar42,0x20);
    auVar18._8_4_ = 0x7fffffff;
    auVar18._0_8_ = 0x7fffffff7fffffff;
    auVar18._12_4_ = 0x7fffffff;
    auVar42 = vandps_avx512vl(auVar33,auVar18);
    auVar40 = vprolq_avx512vl(auVar42,0x20);
    auVar42 = vmaxps_avx(auVar40,auVar42);
    uVar69 = auVar42._0_4_;
    auVar76._4_4_ = uVar69;
    auVar76._0_4_ = uVar69;
    auVar76._8_4_ = uVar69;
    auVar76._12_4_ = uVar69;
    auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
    auVar42 = vmaxps_avx(auVar42,auVar76);
    auVar77._8_4_ = 0x3e2aaaab;
    auVar77._0_8_ = 0x3e2aaaab3e2aaaab;
    auVar77._12_4_ = 0x3e2aaaab;
    auVar63._0_4_ = auVar32._0_4_ * 0.16666667;
    auVar63._4_4_ = auVar32._4_4_ * 0.16666667;
    auVar63._8_4_ = auVar32._8_4_ * 0.16666667;
    auVar63._12_4_ = auVar32._12_4_ * 0.16666667;
    auVar19._8_4_ = 0x3f2aaaab;
    auVar19._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar19._12_4_ = 0x3f2aaaab;
    auVar32 = vfmadd231ps_avx512vl(auVar63,auVar70,auVar19);
    auVar40 = vfmadd231ps_fma(auVar32,auVar77,auVar71);
    auVar39 = vminps_avx(auVar39,auVar40);
    auVar32 = vmaxps_avx(auVar41,auVar40);
    auVar41 = vshufps_avx(auVar40,auVar40,0xff);
    auVar20._8_4_ = 0x7fffffff;
    auVar20._0_8_ = 0x7fffffff7fffffff;
    auVar20._12_4_ = 0x7fffffff;
    auVar41 = vandps_avx512vl(auVar41,auVar20);
    auVar41 = vmaxps_avx(auVar42,auVar41);
    auVar39 = vsubps_avx(auVar39,auVar41);
    auVar38._0_4_ = auVar32._0_4_ + auVar41._0_4_;
    auVar38._4_4_ = auVar32._4_4_ + auVar41._4_4_;
    auVar38._8_4_ = auVar32._8_4_ + auVar41._8_4_;
    auVar38._12_4_ = auVar32._12_4_ + auVar41._12_4_;
  }
  else {
    if ((int)uVar5 < 0) {
      auVar59 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar39 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
      auVar56 = ZEXT1632(auVar39);
      auVar58 = auVar57;
      auVar44 = auVar57;
      auVar54 = auVar59;
      auVar55 = auVar59;
    }
    else {
      auVar43 = vpbroadcastd_avx512vl();
      auVar85._8_4_ = 1;
      auVar85._0_8_ = 0x100000001;
      auVar85._12_4_ = 1;
      auVar85._16_4_ = 1;
      auVar85._20_4_ = 1;
      auVar85._24_4_ = 1;
      auVar85._28_4_ = 1;
      auVar62 = vpermps_avx2(auVar85,ZEXT1632(auVar41));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar45 = vpermps_avx512vl(auVar44,ZEXT1632(auVar41));
      auVar68._4_4_ = fVar12;
      auVar68._0_4_ = fVar12;
      auVar68._8_4_ = fVar12;
      auVar68._12_4_ = fVar12;
      auVar68._16_4_ = fVar12;
      auVar68._20_4_ = fVar12;
      auVar68._24_4_ = fVar12;
      auVar68._28_4_ = fVar12;
      auVar74._4_4_ = uVar81;
      auVar74._0_4_ = uVar81;
      auVar74._8_4_ = uVar81;
      auVar74._12_4_ = uVar81;
      auVar74._16_4_ = uVar81;
      auVar74._20_4_ = uVar81;
      auVar74._24_4_ = uVar81;
      auVar74._28_4_ = uVar81;
      auVar15 = vpermps_avx2(auVar85,ZEXT1632(auVar42));
      auVar46 = vpermps_avx512vl(auVar44,ZEXT1632(auVar42));
      auVar78._4_4_ = fVar13;
      auVar78._0_4_ = fVar13;
      auVar78._8_4_ = fVar13;
      auVar78._12_4_ = fVar13;
      auVar78._16_4_ = fVar13;
      auVar78._20_4_ = fVar13;
      auVar78._24_4_ = fVar13;
      auVar78._28_4_ = fVar13;
      uVar81 = auVar40._0_4_;
      auVar79._4_4_ = uVar81;
      auVar79._0_4_ = uVar81;
      auVar79._8_4_ = uVar81;
      auVar79._12_4_ = uVar81;
      auVar79._16_4_ = uVar81;
      auVar79._20_4_ = uVar81;
      auVar79._24_4_ = uVar81;
      auVar79._28_4_ = uVar81;
      auVar16 = vpermps_avx2(auVar85,ZEXT1632(auVar40));
      auVar47 = vpermps_avx512vl(auVar44,ZEXT1632(auVar40));
      auVar82._4_4_ = fVar14;
      auVar82._0_4_ = fVar14;
      auVar82._8_4_ = fVar14;
      auVar82._12_4_ = fVar14;
      auVar82._16_4_ = fVar14;
      auVar82._20_4_ = fVar14;
      auVar82._24_4_ = fVar14;
      auVar82._28_4_ = fVar14;
      uVar81 = auVar39._0_4_;
      auVar83._4_4_ = uVar81;
      auVar83._0_4_ = uVar81;
      auVar83._8_4_ = uVar81;
      auVar83._12_4_ = uVar81;
      auVar83._16_4_ = uVar81;
      auVar83._20_4_ = uVar81;
      auVar83._24_4_ = uVar81;
      auVar83._28_4_ = uVar81;
      auVar85 = vpermps_avx2(auVar85,ZEXT1632(auVar39));
      auVar48 = vpermps_avx512vl(auVar44,ZEXT1632(auVar39));
      auVar49 = vbroadcastss_avx512vl(auVar32);
      lVar29 = uVar27 * 0x44;
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar39 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      auVar86 = ZEXT1664(auVar39);
      uVar28 = 0;
      auVar61 = auVar51;
      auVar22 = auVar50;
      auVar52 = auVar50;
      auVar53 = auVar51;
      do {
        auVar44 = vpbroadcastd_avx512vl();
        auVar54 = vpord_avx512vl(auVar44,_DAT_01fe9900);
        auVar44 = *(undefined1 (*) [32])(bspline_basis0 + uVar28 * 4 + lVar29);
        auVar59 = *(undefined1 (*) [32])(lVar29 + 0x21aefac + uVar28 * 4);
        auVar58 = *(undefined1 (*) [32])(lVar29 + 0x21af430 + uVar28 * 4);
        uVar17 = vpcmpgtd_avx512vl(auVar54,auVar43);
        auVar54 = *(undefined1 (*) [32])(lVar29 + 0x21af8b4 + uVar28 * 4);
        auVar55 = vmulps_avx512vl(auVar83,auVar54);
        auVar56 = vmulps_avx512vl(auVar85,auVar54);
        auVar57 = vmulps_avx512vl(auVar48,auVar54);
        auVar54 = vmulps_avx512vl(auVar49,auVar54);
        auVar55 = vfmadd231ps_avx512vl(auVar55,auVar58,auVar79);
        auVar56 = vfmadd231ps_avx512vl(auVar56,auVar58,auVar16);
        auVar57 = vfmadd231ps_avx512vl(auVar57,auVar58,auVar47);
        auVar58 = vfmadd231ps_avx512vl(auVar54,auVar82,auVar58);
        auVar54 = vfmadd231ps_avx512vl(auVar55,auVar59,auVar74);
        auVar55 = vfmadd231ps_avx512vl(auVar56,auVar59,auVar15);
        auVar56 = vfmadd231ps_avx512vl(auVar57,auVar59,auVar46);
        auVar59 = vfmadd231ps_avx512vl(auVar58,auVar78,auVar59);
        auVar60._4_4_ = uVar69;
        auVar60._0_4_ = uVar69;
        auVar60._8_4_ = uVar69;
        auVar60._12_4_ = uVar69;
        auVar60._16_4_ = uVar69;
        auVar60._20_4_ = uVar69;
        auVar60._24_4_ = uVar69;
        auVar60._28_4_ = uVar69;
        auVar58 = vfmadd231ps_avx512vl(auVar54,auVar44,auVar60);
        auVar57 = vfmadd231ps_avx512vl(auVar55,auVar44,auVar62);
        auVar56 = vfmadd231ps_avx512vl(auVar56,auVar44,auVar45);
        auVar60 = vfmadd231ps_avx512vl(auVar59,auVar68,auVar44);
        auVar21._8_4_ = 0x7fffffff;
        auVar21._0_8_ = 0x7fffffff7fffffff;
        auVar21._12_4_ = 0x7fffffff;
        auVar21._16_4_ = 0x7fffffff;
        auVar21._20_4_ = 0x7fffffff;
        auVar21._24_4_ = 0x7fffffff;
        auVar21._28_4_ = 0x7fffffff;
        vandps_avx512vl(auVar60,auVar21);
        auVar44 = vminps_avx512vl(auVar53,auVar58);
        bVar9 = (byte)uVar17;
        auVar54._0_4_ = (uint)(bVar9 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar44._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar54._4_4_ = (uint)bVar10 * auVar53._4_4_ | (uint)!bVar10 * auVar44._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar54._8_4_ = (uint)bVar10 * auVar53._8_4_ | (uint)!bVar10 * auVar44._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar54._12_4_ = (uint)bVar10 * auVar53._12_4_ | (uint)!bVar10 * auVar44._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar54._16_4_ = (uint)bVar10 * auVar53._16_4_ | (uint)!bVar10 * auVar44._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar54._20_4_ = (uint)bVar10 * auVar53._20_4_ | (uint)!bVar10 * auVar44._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar54._24_4_ = (uint)bVar10 * auVar53._24_4_ | (uint)!bVar10 * auVar44._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar54._28_4_ = (uint)bVar10 * auVar53._28_4_ | (uint)!bVar10 * auVar44._28_4_;
        auVar44 = vminps_avx512vl(auVar61,auVar57);
        auVar59._0_4_ = (uint)(bVar9 & 1) * auVar61._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar44._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar59._4_4_ = (uint)bVar10 * auVar61._4_4_ | (uint)!bVar10 * auVar44._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar59._8_4_ = (uint)bVar10 * auVar61._8_4_ | (uint)!bVar10 * auVar44._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar59._12_4_ = (uint)bVar10 * auVar61._12_4_ | (uint)!bVar10 * auVar44._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar59._16_4_ = (uint)bVar10 * auVar61._16_4_ | (uint)!bVar10 * auVar44._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar59._20_4_ = (uint)bVar10 * auVar61._20_4_ | (uint)!bVar10 * auVar44._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar59._24_4_ = (uint)bVar10 * auVar61._24_4_ | (uint)!bVar10 * auVar44._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar59._28_4_ = (uint)bVar10 * auVar61._28_4_ | (uint)!bVar10 * auVar44._28_4_;
        auVar44 = vminps_avx512vl(auVar51,auVar56);
        auVar55._0_4_ = (uint)(bVar9 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar44._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar10 * auVar51._4_4_ | (uint)!bVar10 * auVar44._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar10 * auVar51._8_4_ | (uint)!bVar10 * auVar44._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar10 * auVar51._12_4_ | (uint)!bVar10 * auVar44._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar10 * auVar51._16_4_ | (uint)!bVar10 * auVar44._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar10 * auVar51._20_4_ | (uint)!bVar10 * auVar44._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar10 * auVar51._24_4_ | (uint)!bVar10 * auVar44._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar55._28_4_ = (uint)bVar10 * auVar51._28_4_ | (uint)!bVar10 * auVar44._28_4_;
        auVar44 = vmaxps_avx512vl(auVar52,auVar58);
        auVar58._0_4_ = (uint)(bVar9 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar44._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar58._4_4_ = (uint)bVar10 * auVar52._4_4_ | (uint)!bVar10 * auVar44._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar58._8_4_ = (uint)bVar10 * auVar52._8_4_ | (uint)!bVar10 * auVar44._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar58._12_4_ = (uint)bVar10 * auVar52._12_4_ | (uint)!bVar10 * auVar44._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar58._16_4_ = (uint)bVar10 * auVar52._16_4_ | (uint)!bVar10 * auVar44._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar58._20_4_ = (uint)bVar10 * auVar52._20_4_ | (uint)!bVar10 * auVar44._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar58._24_4_ = (uint)bVar10 * auVar52._24_4_ | (uint)!bVar10 * auVar44._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar58._28_4_ = (uint)bVar10 * auVar52._28_4_ | (uint)!bVar10 * auVar44._28_4_;
        auVar57 = vmaxps_avx512vl(auVar22,auVar57);
        auVar44._0_4_ = (uint)(bVar9 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar57._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar44._4_4_ = (uint)bVar10 * auVar22._4_4_ | (uint)!bVar10 * auVar57._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar44._8_4_ = (uint)bVar10 * auVar22._8_4_ | (uint)!bVar10 * auVar57._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar44._12_4_ = (uint)bVar10 * auVar22._12_4_ | (uint)!bVar10 * auVar57._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar44._16_4_ = (uint)bVar10 * auVar22._16_4_ | (uint)!bVar10 * auVar57._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar44._20_4_ = (uint)bVar10 * auVar22._20_4_ | (uint)!bVar10 * auVar57._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar44._24_4_ = (uint)bVar10 * auVar22._24_4_ | (uint)!bVar10 * auVar57._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar44._28_4_ = (uint)bVar10 * auVar22._28_4_ | (uint)!bVar10 * auVar57._28_4_;
        auVar56 = vmaxps_avx512vl(auVar50,auVar56);
        auVar57._0_4_ = (uint)(bVar9 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar56._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar57._4_4_ = (uint)bVar10 * auVar50._4_4_ | (uint)!bVar10 * auVar56._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar57._8_4_ = (uint)bVar10 * auVar50._8_4_ | (uint)!bVar10 * auVar56._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar57._12_4_ = (uint)bVar10 * auVar50._12_4_ | (uint)!bVar10 * auVar56._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar57._16_4_ = (uint)bVar10 * auVar50._16_4_ | (uint)!bVar10 * auVar56._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar57._20_4_ = (uint)bVar10 * auVar50._20_4_ | (uint)!bVar10 * auVar56._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar57._24_4_ = (uint)bVar10 * auVar50._24_4_ | (uint)!bVar10 * auVar56._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar57._28_4_ = (uint)bVar10 * auVar50._28_4_ | (uint)!bVar10 * auVar56._28_4_;
        auVar61 = vmaxps_avx512vl(auVar86._0_32_,auVar60);
        auVar56._0_4_ = (uint)(bVar9 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar61._0_4_
        ;
        bVar10 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar56._4_4_ = (uint)bVar10 * auVar86._4_4_ | (uint)!bVar10 * auVar61._4_4_;
        bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar56._8_4_ = (uint)bVar10 * auVar86._8_4_ | (uint)!bVar10 * auVar61._8_4_;
        bVar10 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar56._12_4_ = (uint)bVar10 * auVar86._12_4_ | (uint)!bVar10 * auVar61._12_4_;
        bVar10 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar56._16_4_ = (uint)bVar10 * auVar86._16_4_ | (uint)!bVar10 * auVar61._16_4_;
        bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar56._20_4_ = (uint)bVar10 * auVar86._20_4_ | (uint)!bVar10 * auVar61._20_4_;
        bVar10 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar56._24_4_ = (uint)bVar10 * auVar86._24_4_ | (uint)!bVar10 * auVar61._24_4_;
        bVar10 = SUB81(uVar17 >> 7,0);
        auVar56._28_4_ = (uint)bVar10 * auVar86._28_4_ | (uint)!bVar10 * auVar61._28_4_;
        uVar28 = uVar28 + 8;
        auVar86 = ZEXT3264(auVar56);
        auVar51 = auVar55;
        auVar50 = auVar57;
        auVar61 = auVar59;
        auVar22 = auVar44;
        auVar52 = auVar58;
        auVar53 = auVar54;
      } while (uVar28 <= uVar27);
    }
    auVar62 = vshufps_avx512vl(auVar54,auVar54,0xb1);
    auVar62 = vminps_avx512vl(auVar54,auVar62);
    auVar54 = vshufpd_avx(auVar62,auVar62,5);
    auVar54 = vminps_avx(auVar62,auVar54);
    auVar39 = vminps_avx(auVar54._0_16_,auVar54._16_16_);
    auVar54 = vshufps_avx512vl(auVar59,auVar59,0xb1);
    auVar54 = vminps_avx512vl(auVar59,auVar54);
    auVar59 = vshufpd_avx(auVar54,auVar54,5);
    auVar59 = vminps_avx(auVar54,auVar59);
    auVar32 = vminps_avx(auVar59._0_16_,auVar59._16_16_);
    auVar32 = vunpcklps_avx(auVar39,auVar32);
    auVar59 = vshufps_avx512vl(auVar55,auVar55,0xb1);
    auVar54 = vminps_avx512vl(auVar55,auVar59);
    auVar59 = vshufpd_avx(auVar54,auVar54,5);
    auVar59 = vminps_avx(auVar54,auVar59);
    auVar39 = vminps_avx(auVar59._0_16_,auVar59._16_16_);
    auVar39 = vinsertps_avx(auVar32,auVar39,0x28);
    auVar59 = vshufps_avx512vl(auVar58,auVar58,0xb1);
    auVar58 = vmaxps_avx512vl(auVar58,auVar59);
    auVar59 = vshufpd_avx(auVar58,auVar58,5);
    auVar59 = vmaxps_avx(auVar58,auVar59);
    auVar32 = vmaxps_avx(auVar59._0_16_,auVar59._16_16_);
    auVar59 = vshufps_avx512vl(auVar44,auVar44,0xb1);
    auVar59 = vmaxps_avx512vl(auVar44,auVar59);
    auVar44 = vshufpd_avx(auVar59,auVar59,5);
    auVar44 = vmaxps_avx(auVar59,auVar44);
    auVar41 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
    auVar41 = vunpcklps_avx(auVar32,auVar41);
    auVar44 = vshufps_avx512vl(auVar57,auVar57,0xb1);
    auVar59 = vmaxps_avx512vl(auVar57,auVar44);
    auVar44 = vshufpd_avx(auVar59,auVar59,5);
    auVar44 = vmaxps_avx(auVar59,auVar44);
    auVar32 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
    auVar32 = vinsertps_avx(auVar41,auVar32,0x28);
    auVar44 = vshufps_avx512vl(auVar56,auVar56,0xb1);
    auVar59 = vmaxps_avx512vl(auVar56,auVar44);
    auVar44 = vshufpd_avx(auVar59,auVar59,5);
    auVar44 = vmaxps_avx(auVar59,auVar44);
    auVar41 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
    auVar66._0_4_ = auVar41._0_4_;
    auVar66._4_4_ = auVar66._0_4_;
    auVar66._8_4_ = auVar66._0_4_;
    auVar66._12_4_ = auVar66._0_4_;
    auVar39 = vsubps_avx(auVar39,auVar66);
    auVar38._0_4_ = auVar32._0_4_ + auVar66._0_4_;
    auVar38._4_4_ = auVar32._4_4_ + auVar66._0_4_;
    auVar38._8_4_ = auVar32._8_4_ + auVar66._0_4_;
    auVar38._12_4_ = auVar32._12_4_ + auVar66._0_4_;
  }
  auVar64._8_4_ = 0x7fffffff;
  auVar64._0_8_ = 0x7fffffff7fffffff;
  auVar64._12_4_ = 0x7fffffff;
  auVar32 = vandps_avx(auVar39,auVar64);
  auVar41 = vandps_avx(auVar38,auVar64);
  auVar32 = vmaxps_avx(auVar32,auVar41);
  auVar41 = vmovshdup_avx(auVar32);
  auVar41 = vmaxss_avx(auVar41,auVar32);
  auVar32 = vshufpd_avx(auVar32,auVar32,1);
  auVar32 = vmaxss_avx(auVar32,auVar41);
  fVar1 = auVar32._0_4_ * 4.7683716e-07;
  auVar65._4_4_ = fVar1;
  auVar65._0_4_ = fVar1;
  auVar65._8_4_ = fVar1;
  auVar65._12_4_ = fVar1;
  aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar39,auVar65);
  (__return_storage_ptr__->lower).field_0 = aVar2;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar38._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar38._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar38._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar38._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }